

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

void __thiscall DiskTable::persistent(DiskTable *this,MemTable *m,bool df)

{
  ulong uVar1;
  _List_iterator<DiskTableNode> __x;
  pointer pSVar2;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *plVar3;
  bool bVar4;
  _List_iterator<DiskTableNode> _Var5;
  SSTableData *pSVar6;
  SSTableData *datas_2;
  iterator __position;
  size_t sVar7;
  _List_node_base *p_Var8;
  pointer s;
  DiskViewLevelIter level;
  DiskViewLevelIter level_00;
  DiskTableNode *pDVar9;
  int local_114;
  undefined1 local_108 [40];
  DiskTableNode *local_e0;
  DiskTableNode new_disk_node;
  size_t blocked_data_bytes;
  anon_class_8_1_8991fb9c writeFileName;
  DiskTableNode persistent_node;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_88;
  _List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  local_70;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *local_58;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *local_50;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> local_48;
  
  new_disk_node._sstable = (SSTable *)0x0;
  new_disk_node.filter = (Filter *)0x0;
  new_disk_node.index = (IndexMap *)0x0;
  MemTable::collectData((SSTableData *)local_108,m);
  DiskTableNode::fillData(&new_disk_node,(SSTableData *)local_108);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_108);
  level_00._M_current =
       (this->diskView).
       super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_114 = this->LEVEL0_LIMIT;
  uVar1 = ((level_00._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>).
          _M_impl._M_node._M_size;
  writeFileName.this = this;
  if (uVar1 < (ulong)(long)local_114) {
    persistent::anon_class_8_1_8991fb9c::operator()((path *)local_108,&writeFileName,level_00);
    DiskTableNode::writeToDisk(&new_disk_node,(path *)local_108);
    std::filesystem::__cxx11::path::~path((path *)local_108);
    SSTable::clearDataCache(new_disk_node._sstable);
    std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::push_back
              (level_00._M_current,&new_disk_node);
  }
  else if (uVar1 == (long)local_114) {
    level._M_current = level_00._M_current + 1;
    if (level._M_current ==
        (this->diskView).
        super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_108._16_8_ = (pointer)0x0;
      local_108._0_8_ = (pointer)local_108;
      local_108._8_8_ = (pointer)local_108;
      std::
      vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
      ::emplace_back<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>
                ((vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
                  *)this,(list<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_108);
      std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
                ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_108);
      local_114 = this->LEVEL0_LIMIT;
    }
    local_114 = local_114 * this->LEVEL_FACTOR;
    local_88.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_70;
    local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
    local_70._M_impl._M_node._M_size = 0;
    local_88.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (SSTableDataEntry *)0x0;
    local_88.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (SSTableDataEntry *)0x0;
    local_58 = level_00._M_current;
    while( true ) {
      local_50 = level_00._M_current;
      if (level_00._M_current ==
          (this->diskView).
          super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __x._M_node = ((level_00._M_current)->
                      super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>)._M_impl.
                      _M_node.super__List_node_base._M_next;
        _Var5 = std::next<std::_List_iterator<DiskTableNode>>(__x,1);
        local_e0 = (DiskTableNode *)DiskTableNode::getAllData(&new_disk_node);
        pSVar6 = DiskTableNode::getAllData((DiskTableNode *)(_Var5._M_node + 1));
        pDVar9 = (DiskTableNode *)(__x._M_node + 1);
        datas_2 = DiskTableNode::getAllData(pDVar9);
        merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
                  ((SSTableData *)local_108,this,
                   (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_e0,pSVar6,
                   datas_2);
        local_e0 = pDVar9;
        std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::_M_move_assign
                  (&local_88,(path *)local_108);
        std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                  ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_108);
        DiskTableNode::getFile_abi_cxx11_((path *)local_108,(DiskTableNode *)(_Var5._M_node + 1));
        std::__cxx11::
        list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                   *)&local_70,(path *)local_108);
        std::filesystem::__cxx11::path::~path((path *)local_108);
        DiskTableNode::getFile_abi_cxx11_((path *)local_108,local_e0);
        std::__cxx11::
        list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                   *)&local_70,(path *)local_108);
        std::filesystem::__cxx11::path::~path((path *)local_108);
        std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::clear(local_58);
      }
      __position._M_node =
           ((level._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>).
           _M_impl._M_node.super__List_node_base._M_next;
      while (pSVar2 = local_88.
                      super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
            __position._M_node != (_List_node_base *)level._M_current) {
        pDVar9 = (DiskTableNode *)(__position._M_node + 1);
        bVar4 = DiskTableNode::intersect(pDVar9,&local_88);
        if (bVar4) {
          pSVar6 = DiskTableNode::getAllData(pDVar9);
          merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
                    ((SSTableData *)local_108,this,&local_88,pSVar6);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::_M_move_assign
                    (&local_88,(SSTableData *)local_108);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                    ((SSTableData *)local_108);
          DiskTableNode::clearDataCache(pDVar9);
          DiskTableNode::getFile_abi_cxx11_((path *)local_108,pDVar9);
          std::__cxx11::
          list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
          push_back((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)&local_70,(path *)local_108);
          std::filesystem::__cxx11::path::~path((path *)local_108);
          __position = std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::erase
                                 (level._M_current,__position._M_node);
        }
        else {
          __position._M_node = (__position._M_node)->_M_next;
        }
      }
      s = local_88.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_start;
      while ((plVar3 = local_50,
             ((level._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>).
             _M_impl._M_node._M_size < (ulong)(long)local_114 && (s != pSVar2))) {
        local_48.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        blocked_data_bytes = 0;
        for (; (blocked_data_bytes <= (ulong)(long)this->SSTABLE_SIZE_LIMIT && (s != pSVar2));
            s = s + 1) {
          sVar7 = size_of_entry(s);
          blocked_data_bytes = blocked_data_bytes + sVar7;
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back(&local_48,s);
        }
        persistent_node._sstable = (SSTable *)0x0;
        persistent_node.filter = (Filter *)0x0;
        persistent_node.index = (IndexMap *)0x0;
        DiskTableNode::fillData(&persistent_node,&local_48);
        persistent::anon_class_8_1_8991fb9c::operator()((path *)local_108,&writeFileName,level);
        DiskTableNode::writeToDisk(&persistent_node,(path *)local_108);
        std::filesystem::__cxx11::path::~path((path *)local_108);
        SSTable::clearDataCache(persistent_node._sstable);
        std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::push_back
                  (level._M_current,&persistent_node);
        DiskTableNode::~DiskTableNode(&persistent_node);
        std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_48);
      }
      if (s == pSVar2) break;
      level._M_current = level._M_current + 1;
      if (level._M_current ==
          (this->diskView).
          super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_108._16_8_ = (pointer)0x0;
        local_108._0_8_ = (pointer)local_108;
        local_108._8_8_ = (pointer)local_108;
        std::
        vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
        ::emplace_back<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>
                  ((vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
                    *)this,(list<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_108);
        std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
                  ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_108);
      }
      level_00._M_current = plVar3 + 1;
      local_114 = local_114 * this->LEVEL_FACTOR;
    }
    p_Var8 = (_List_node_base *)&local_70;
    while (p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&local_70) {
      std::filesystem::remove((path *)(p_Var8 + 1));
    }
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::clear(&local_88);
    std::__cxx11::
    _List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    _M_clear(&local_70);
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_88);
  }
  DiskTableNode::~DiskTableNode(&new_disk_node);
  return;
}

Assistant:

void DiskTable::persistent(MemTable &&m, bool df) {
    auto new_disk_node = DiskTableNode{};
    new_disk_node.fillData(m.collectData());
    auto level0 = diskView.begin();
    auto writeFileName = [this](DiskViewLevelIter level) {
        this->SSTableClock += 1;
        auto parent_dir = this->db_home / path{std::to_string(std::distance(this->diskView.begin(), level))};
        if (!exists(parent_dir)) {
            create_directory(parent_dir);
        }
        return parent_dir / (path{std::to_string(this->SSTableClock) + ".bin"});
    };
    if (level0->size() < LEVEL0_LIMIT) {
        new_disk_node.writeToDisk(writeFileName(level0));
        new_disk_node.clearDataCache();
        level0->push_back(std::move(new_disk_node));
        return;
    }
    if (level0->size() == LEVEL0_LIMIT) {
        auto cur_level = diskView.begin();
        if (std::next(cur_level) == diskView.end()) {
            diskView.push_back(DiskViewLevel{});
        }
        auto compaction_into_level = std::next(cur_level);
        auto compaction_into_level_limit = LEVEL0_LIMIT * LEVEL_FACTOR;
        auto overflow_data = SSTableData{};
        auto to_remove_file = std::list<path>{};
        while (true) {
            if (cur_level == diskView.begin()) {
                auto level0_0 = cur_level->begin();
                auto level0_1 = std::next(level0_0, 1);
                overflow_data = merge(new_disk_node.getAllData(), level0_1->getAllData(), level0_0->getAllData());
                to_remove_file.push_back(level0_1->getFile());
                to_remove_file.push_back(level0_0->getFile());
                level0->clear();
            }

            for (auto to_compaction_node = compaction_into_level->begin();
                 to_compaction_node != compaction_into_level->end();) {
                if (to_compaction_node->intersect(overflow_data)) {
                    overflow_data = merge(&overflow_data, to_compaction_node->getAllData());
                    to_compaction_node->clearDataCache();
                    to_remove_file.push_back(to_compaction_node->getFile());
                    to_compaction_node = compaction_into_level->erase(to_compaction_node);
                    continue;
                }
                to_compaction_node++;
            }

            auto cur_overflow_entry = overflow_data.begin();
            auto overflow_end = overflow_data.end();

            while (compaction_into_level->size() < compaction_into_level_limit && cur_overflow_entry != overflow_end) {
                auto persistent_data_block = SSTableData{};
                volatile size_t blocked_data_bytes = 0;
                while (blocked_data_bytes <= SSTABLE_SIZE_LIMIT && cur_overflow_entry != overflow_end) {
                    blocked_data_bytes += size_of_entry(*cur_overflow_entry);
                    persistent_data_block.push_back(*cur_overflow_entry);
                    cur_overflow_entry++;
                }
                auto persistent_node = DiskTableNode{};
                persistent_node.fillData(std::move(persistent_data_block));
                persistent_node.writeToDisk(writeFileName(compaction_into_level));
                persistent_node.clearDataCache();
                compaction_into_level->push_back(std::move(persistent_node));
            }

            if (cur_overflow_entry == overflow_end) {
                std::for_each(to_remove_file.begin(), to_remove_file.end(), [](path &file) { remove(file); });
                overflow_data.clear();
                break;
            }

            if (std::next(compaction_into_level) == diskView.end()) {
                diskView.push_back(DiskViewLevel{});
            }

            cur_level++;
            compaction_into_level++;
            compaction_into_level_limit *= LEVEL_FACTOR;
        }
    }
}